

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::AssertionResult::~AssertionResult(AssertionResult *this)

{
  AssertionResult *this_local;
  
  AssertionResultData::~AssertionResultData(&this->m_resultData);
  AssertionInfo::~AssertionInfo(&this->m_info);
  return;
}

Assistant:

AssertionResult::~AssertionResult() {}